

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Frag __thiscall duckdb_re2::Compiler::Capture(Compiler *this,Frag a,int n)

{
  long lVar1;
  Inst *pIVar2;
  Frag FVar3;
  uint uVar4;
  uint uVar5;
  uint local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  uint uStack_4c;
  uint uStack_34;
  bool bStack_2c;
  
  if (a.begin != 0) {
    local_58 = AllocInst(this,2);
    if (-1 < (int)local_58) {
      Prog::Inst::InitCapture
                ((this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl + local_58,
                 n * 2,a.begin);
      uVar5 = local_58 + 1;
      Prog::Inst::InitCapture
                ((this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl +
                 (ulong)local_58 + 1,n * 2 + 1,0);
      uStack_34 = a.end.head;
      if (uStack_34 != 0) {
        pIVar2 = (this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
        do {
          uVar4 = uStack_34 >> 1;
          if ((uStack_34 & 1) == 0) {
            uStack_34 = pIVar2[uVar4].out_opcode_ >> 4;
            pIVar2[uVar4].out_opcode_ = pIVar2[uVar4].out_opcode_ & 0xf | uVar5 * 0x10;
          }
          else {
            uStack_34 = pIVar2[uVar4].field_1.out1_;
            pIVar2[uVar4].field_1.out1_ = uVar5;
          }
        } while (uStack_34 != 0);
      }
      lVar1 = ((ulong)uVar5 << 0x21) + (ulong)uVar5 * 2;
      bStack_2c = a.nullable;
      uStack_4c = CONCAT31(uStack_4c._1_3_,bStack_2c) & 0xffffff01;
      goto LAB_004860ef;
    }
  }
  local_58 = 0;
  lVar1 = 0;
  uStack_4c = (uint)uStack_4c._1_3_ << 8;
LAB_004860ef:
  uStack_50 = (undefined4)((ulong)lVar1 >> 0x20);
  uStack_54 = (undefined4)lVar1;
  FVar3.end.head = uStack_54;
  FVar3.begin = local_58;
  FVar3.end.tail = uStack_50;
  FVar3._12_4_ = uStack_4c;
  return FVar3;
}

Assistant:

Frag Compiler::Capture(Frag a, int n) {
  if (IsNoMatch(a))
    return NoMatch();
  int id = AllocInst(2);
  if (id < 0)
    return NoMatch();
  inst_[id].InitCapture(2*n, a.begin);
  inst_[id+1].InitCapture(2*n+1, 0);
  PatchList::Patch(inst_.data(), a.end, id+1);

  return Frag(id, PatchList::Mk((id+1) << 1), a.nullable);
}